

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

void __thiscall bloaty::Options::Options(Options *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Options_005ce2d0;
  memset(&this->_internal_metadata_,0,0xa0);
  if (scc_info_Options_bloaty_2eproto.base.visit_status.super___atomic_base<int>._M_i != 0) {
    google::protobuf::internal::InitSCCImpl(&scc_info_Options_bloaty_2eproto.base);
  }
  (this->disassemble_function_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->source_filter_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->demangle_ = 0;
  this->sort_by_ = 0;
  this->verbose_level_ = 0;
  this->dump_raw_map_ = false;
  *(undefined3 *)&this->field_0xc5 = 0;
  this->debug_vmaddr_ = 0;
  this->debug_fileoff_ = 0;
  this->max_rows_per_level_ = 0x14;
  return;
}

Assistant:

Options::Options()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:bloaty.Options)
}